

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.h
# Opt level: O0

void __thiscall
cfd::api::json::ElementsDecodeRawTransactionTxOut::ElementsDecodeRawTransactionTxOut
          (ElementsDecodeRawTransactionTxOut *this)

{
  JsonClassBase<cfd::api::json::ElementsDecodeRawTransactionTxOut> *in_RDI;
  ElementsDecodeLockingScript *unaff_retaddr;
  allocator local_21;
  allocator local_20;
  allocator local_1f;
  allocator local_1e;
  allocator local_1d [20];
  allocator local_9 [9];
  
  core::JsonClassBase<cfd::api::json::ElementsDecodeRawTransactionTxOut>::JsonClassBase(in_RDI);
  in_RDI->_vptr_JsonClassBase = (_func_int **)&PTR__ElementsDecodeRawTransactionTxOut_009f9ba8;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x68bebe);
  in_RDI[7]._vptr_JsonClassBase = (_func_int **)0x0;
  in_RDI[8]._vptr_JsonClassBase = (_func_int **)0x0;
  in_RDI[9]._vptr_JsonClassBase = (_func_int **)0x0;
  *(undefined4 *)&in_RDI[10]._vptr_JsonClassBase = 0;
  *(undefined4 *)((long)&in_RDI[10]._vptr_JsonClassBase + 4) = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 0xb),"",local_9);
  std::allocator<char>::~allocator((allocator<char> *)local_9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 0xf),"",local_1d);
  std::allocator<char>::~allocator((allocator<char> *)local_1d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 0x13),"",&local_1e);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 0x17),"",&local_1f);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 0x1b),"",&local_20);
  std::allocator<char>::~allocator((allocator<char> *)&local_20);
  *(undefined1 *)&in_RDI[0x1f]._vptr_JsonClassBase = 0;
  *(undefined4 *)((long)&in_RDI[0x1f]._vptr_JsonClassBase + 4) = 0;
  ElementsDecodeLockingScript::ElementsDecodeLockingScript(unaff_retaddr);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 0x4d),"",&local_21);
  std::allocator<char>::~allocator((allocator<char> *)&local_21);
  CollectFieldName();
  return;
}

Assistant:

ElementsDecodeRawTransactionTxOut() {
    CollectFieldName();
  }